

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O1

void __thiscall
slang::analysis::DataFlowAnalysis::handle(DataFlowAnalysis *this,AssignmentExpression *expr)

{
  TimingControl *this_00;
  bool bVar1;
  AnalysisContext *local_20;
  Symbol *local_18;
  
  this->isLValue = true;
  ast::Expression::visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
            (expr->left_,expr->left_,this);
  this->isLValue = false;
  bVar1 = ast::AssignmentExpression::isLValueArg(expr);
  if (!bVar1) {
    ast::Expression::
    visitExpression<slang::ast::Expression_const,slang::analysis::DataFlowAnalysis&>
              (expr->right_,expr->right_,this);
  }
  this_00 = expr->timingControl;
  if (this_00 != (TimingControl *)0x0) {
    if (this_00->kind == Invalid) {
      (this->
      super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>)
      .super_FlowAnalysisBase.bad = true;
    }
    else {
      local_20 = this->context;
      local_18 = (this->
                 super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                 ).super_FlowAnalysisBase.rootSymbol;
      ast::TimingControl::visit<slang::analysis::NonProceduralExprVisitor>
                (this_00,(AlwaysFFVisitor *)&stack0xffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void DataFlowAnalysis::handle(const AssignmentExpression& expr) {
    // Note that this method mirrors the logic in the base class
    // handler but we need to track the LValue status of the lhs.
    SLANG_ASSERT(!isLValue);
    isLValue = true;
    visit(expr.left());
    isLValue = false;

    if (!expr.isLValueArg())
        visit(expr.right());

    if (expr.timingControl)
        handleTiming(*expr.timingControl);
}